

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test *this)

{
  ByteData *pBVar1;
  pointer puVar2;
  string **ppsVar3;
  bool bVar4;
  uint32_t uVar5;
  long lVar6;
  char *pcVar7;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  ConfidentialTransactionController ctx;
  AssertionResult gtest_ar;
  uint32_t minimum_fee;
  ConfidentialTransactionContext txc;
  ElementsAddressFactory factory;
  UtxoFilter filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialAssetId fee_asset;
  Amount fee;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  CoinSelectionOption option;
  ExtPubkey key;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr4;
  ElementsConfidentialAddress reserve_ct_addr3;
  Address address4;
  Address address3;
  Address address2;
  Address address1;
  ElementsConfidentialAddress reserve_ct_addr1;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  string local_2d28;
  undefined1 local_2d08 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d00;
  ConfidentialTransaction local_2cf8;
  undefined1 local_2cb8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2cb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2ca8 [11];
  ByteData local_2bf8;
  string local_2bd8;
  Pubkey local_2bb8;
  undefined1 local_2ba0 [184];
  AddressFactory local_2ae8;
  UtxoFilter local_2abc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2ab8;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_2a98;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2a80;
  SigHashType local_2a64;
  SigHashType local_2a58;
  SigHashType local_2a4c;
  ConfidentialAssetId local_2a40;
  Amount local_2a18;
  Amount local_2a08;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_29f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_29c8;
  CoinSelectionOption local_2998;
  ExtPubkey local_2930;
  ElementsConfidentialAddress local_28c0;
  ElementsConfidentialAddress local_2710;
  ElementsConfidentialAddress local_2560;
  Address local_23b0;
  Address local_2238;
  Address local_20c0;
  Address local_1f48;
  undefined1 local_1dd0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1dc0;
  uchar local_1db0 [16];
  pointer local_1da0;
  pointer local_1d88;
  pointer local_1d70;
  TapBranch local_1d58;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1ce0;
  Script local_1cc8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c88 [19];
  UtxoData local_18e0;
  UtxoData local_13f0;
  UtxoData local_f00;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_2ae8,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_a10.block_hash.data_;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)&local_a10);
  cfd::core::Txid::operator=(&local_520.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_520.vout = 0;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_1dd0,(string *)&local_a10);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((Address *)local_1dd0,&local_2ae8,(string *)&local_a10);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if (local_1d88 != (pointer)0x0) {
    operator_delete(local_1d88);
  }
  if (local_1da0 != (pointer)0x0) {
    operator_delete(local_1da0);
  }
  if ((uchar *)local_1dc0._M_allocated_capacity != local_1db0) {
    operator_delete((void *)local_1dc0._M_allocated_capacity);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x58eab2);
  cfd::core::Amount::Amount((Amount *)local_1dd0,2000000000000000);
  local_520.amount.ignore_check_ = local_1dd0[8];
  local_520.amount.amount_ = local_1dd0._0_8_;
  local_520.address_type = kP2pkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_520.asset,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(&local_a10);
  local_a10.block_height = 0;
  local_a10.binary_data = (void *)0x0;
  pBVar1 = &local_f00.block_hash.data_;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)&local_f00);
  cfd::core::Txid::operator=(&local_a10.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_a10.vout = 0;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_1dd0,(string *)&local_f00);
  cfd::core::Script::operator=(&local_a10.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((Address *)local_1dd0,&local_2ae8,(string *)&local_f00);
  cfd::core::Address::operator=(&local_a10.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if (local_1d88 != (pointer)0x0) {
    operator_delete(local_1d88);
  }
  if (local_1da0 != (pointer)0x0) {
    operator_delete(local_1da0);
  }
  if ((uchar *)local_1dc0._M_allocated_capacity != local_1db0) {
    operator_delete((void *)local_1dc0._M_allocated_capacity);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_a10.descriptor,0,(char *)local_a10.descriptor._M_string_length,0x554123);
  cfd::core::Amount::Amount((Amount *)local_1dd0,2000000000000000);
  local_a10.amount.ignore_check_ = local_1dd0[8];
  local_a10.amount.amount_ = local_1dd0._0_8_;
  local_a10.address_type = kP2shP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_a10.asset,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(&local_f00);
  local_f00.block_height = 0;
  local_f00.binary_data = (void *)0x0;
  ppsVar3 = (string **)((long)&local_28c0 + 0x10);
  local_28c0.unblinded_address_._0_8_ = ppsVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_28c0,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3","");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)&local_28c0);
  cfd::core::Txid::operator=(&local_f00.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((string **)local_28c0.unblinded_address_._0_8_ != ppsVar3) {
    operator_delete((void *)local_28c0.unblinded_address_._0_8_);
  }
  local_f00.vout = 1;
  local_28c0.unblinded_address_._0_8_ = ppsVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_28c0,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_1dd0,(string *)&local_28c0);
  cfd::core::Script::operator=(&local_f00.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  if ((string **)local_28c0.unblinded_address_._0_8_ != ppsVar3) {
    operator_delete((void *)local_28c0.unblinded_address_._0_8_);
  }
  local_28c0.unblinded_address_._0_8_ = ppsVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_28c0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress((Address *)local_1dd0,&local_2ae8,(string *)&local_28c0);
  cfd::core::Address::operator=(&local_f00.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if (local_1d88 != (pointer)0x0) {
    operator_delete(local_1d88);
  }
  if (local_1da0 != (pointer)0x0) {
    operator_delete(local_1da0);
  }
  if ((uchar *)local_1dc0._M_allocated_capacity != local_1db0) {
    operator_delete((void *)local_1dc0._M_allocated_capacity);
  }
  if ((string **)local_28c0.unblinded_address_._0_8_ != ppsVar3) {
    operator_delete((void *)local_28c0.unblinded_address_._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_f00.descriptor,0,(char *)local_f00.descriptor._M_string_length,0x58eab1);
  cfd::core::Amount::Amount((Amount *)local_1dd0,50000000000000);
  local_f00.amount.ignore_check_ = local_1dd0[8];
  local_f00.amount.amount_ = local_1dd0._0_8_;
  local_f00.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_f00.asset,&exp_dummy_asset_a);
  local_1dd0._0_8_ = &local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress(&local_1f48,&local_2ae8,(string *)local_1dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dd0._0_8_ != &local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  local_1dd0._0_8_ = &local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu","");
  cfd::AddressFactory::GetAddress(&local_20c0,&local_2ae8,(string *)local_1dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dd0._0_8_ != &local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  local_1dd0._0_8_ = &local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress(&local_2238,&local_2ae8,(string *)local_1dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dd0._0_8_ != &local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  local_1dd0._0_8_ = &local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu","");
  cfd::AddressFactory::GetAddress(&local_23b0,&local_2ae8,(string *)local_1dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dd0._0_8_ != &local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  local_1dd0._0_8_ = &local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_2930,(string *)local_1dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dd0._0_8_ != &local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1dd0,&local_520);
  cfd::UtxoData::UtxoData(&local_18e0,&local_a10);
  cfd::UtxoData::UtxoData(&local_13f0,&local_f00);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1dd0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2a80,__l,(allocator_type *)&local_28c0);
  lVar6 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1dd0 + lVar6));
    lVar6 = lVar6 + -0x4f0;
  } while (lVar6 != -0x4f0);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_28c0,&local_2930,0x5b);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_2560,(ExtPubkey *)&local_28c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1dd0,&local_1f48,(ConfidentialKey *)&local_2560);
  if ((pointer)local_2560.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2560.unblinded_address_._0_8_);
  }
  if (local_28c0.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_28c0.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_28c0.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_28c0.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_28c0.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_28c0.unblinded_address_.address_.field_2._8_8_);
  }
  if ((string **)local_28c0.unblinded_address_._0_8_ != (string **)0x0) {
    operator_delete((void *)local_28c0.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_2560,&local_2930,0x5c);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_2710,(ExtPubkey *)&local_2560);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_28c0,&local_20c0,(ConfidentialKey *)&local_2710);
  if ((pointer)local_2710.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2710.unblinded_address_._0_8_);
  }
  if (local_2560.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_2560.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_2560.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_2560.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_2560.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2560.unblinded_address_.address_.field_2._8_8_);
  }
  if ((pointer)local_2560.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2560.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_2710,&local_2930,0x5d);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_2ba0,(ExtPubkey *)&local_2710);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_2560,&local_2238,(ConfidentialKey *)local_2ba0);
  if ((pointer)local_2ba0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  if (local_2710.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_2710.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_2710.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_2710.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_2710.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2710.unblinded_address_.address_.field_2._8_8_);
  }
  if ((pointer)local_2710.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2710.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2ba0,&local_2930,0x5e);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_2cb8,(ExtPubkey *)local_2ba0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_2710,&local_23b0,(ConfidentialKey *)local_2cb8);
  if (local_2cb8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2cb8);
  }
  if ((pointer)local_2ba0._88_8_ != (pointer)0x0) {
    operator_delete((void *)local_2ba0._88_8_);
  }
  if ((pointer)local_2ba0._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_2ba0._64_8_);
  }
  if ((pointer)local_2ba0._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_2ba0._40_8_);
  }
  if ((pointer)local_2ba0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2a40,&exp_dummy_asset_a);
  local_29f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_29f8._M_impl.super__Rb_tree_header._M_header;
  local_29f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_29f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_29f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_29f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_29f8._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2ba0,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_2cb8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_29f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba0,
             (Amount *)local_2cb8);
  puVar2 = local_2ba0 + 0x10;
  if ((pointer)local_2ba0._0_8_ != puVar2) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2ba0,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)local_2cb8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_29f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba0,
             (Amount *)local_2cb8);
  if ((pointer)local_2ba0._0_8_ != puVar2) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  local_29c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_29c8._M_impl.super__Rb_tree_header._M_header;
  local_29c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_29c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_29c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_29c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_29c8._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2ba0,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_2cb8,&local_2560);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_29c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2cb8);
  if (local_2cb8 != (undefined1  [8])local_2ca8) {
    operator_delete((void *)local_2cb8);
  }
  if ((pointer)local_2ba0._0_8_ != puVar2) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2ba0,&exp_dummy_asset_b);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_2cb8,&local_2710);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_29c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2cb8);
  if (local_2cb8 != (undefined1  [8])local_2ca8) {
    operator_delete((void *)local_2cb8);
  }
  if ((pointer)local_2ba0._0_8_ != puVar2) {
    operator_delete((void *)local_2ba0._0_8_);
  }
  local_2a98.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a98.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a98.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_2a08);
  local_2ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_2998);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_2998);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_2998,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_2998,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&local_2998,&local_2a40);
  cfd::CoinSelectionOption::SetBlindInfo(&local_2998,0,0x34);
  cfd::core::Amount::Amount(&local_2a18,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2ba0,2,0);
  AVar8 = cfd::core::operator-(&local_f00.amount,&local_2a18);
  local_2cb8 = (undefined1  [8])AVar8.amount_;
  sStack_2cb0.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2ba0,(ElementsConfidentialAddress *)local_1dd0,
             (Amount *)local_2cb8,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)local_2cb8,2100000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2ba0,&local_28c0,(Amount *)local_2cb8,
             &exp_dummy_asset_b,false);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_2cb8,(AbstractTransaction *)local_2ba0);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((ConfidentialTransactionController *)local_2d08,(ElementsTransactionApi *)&local_2bd8,
             (string *)local_2cb8,&local_2a80,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_29f8,&local_2a98,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_29c8,&local_2a40,true,0.11,&local_2a08,&local_2abc,&local_2998,&local_2ab8,
             kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_2cb8 != (undefined1  [8])local_2ca8) {
    operator_delete((void *)local_2cb8);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            (&local_2d28,(AbstractTransactionController *)local_2d08);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2cb8,&local_2d28);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_2ba0,
             (ConfidentialTransactionContext *)local_2cb8);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2cb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d28._M_dataplus._M_p != &local_2d28.field_2) {
    operator_delete(local_2d28._M_dataplus._M_p);
  }
  local_2d08 = (undefined1  [8])&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_2cf8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                ((ConfidentialTransactionContext *)local_2ba0,&local_2a80);
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4b9,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ByteData::ByteData(&local_2bf8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_520.txid,local_520.vout);
      local_2d08 = (undefined1  [8])&local_2cf8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d08,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2bb8,(string *)local_2d08);
      local_2bd8._M_dataplus._M_p = (pointer)&local_2bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2bd8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2d28,&local_2bd8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2a4c);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8,&local_2bb8,
                 (Privkey *)&local_2d28,&local_2a4c,true);
      if (local_2d28._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2d28._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2bd8._M_dataplus._M_p != &local_2bd8.field_2) {
        operator_delete(local_2bd8._M_dataplus._M_p);
      }
      if (local_2bb8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bb8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2d08 != (undefined1  [8])&local_2cf8) {
        operator_delete((void *)local_2d08);
      }
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c0,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_520.txid,local_520.vout);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8);
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c1,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2cb8,(ConfidentialTransactionContext *)local_2ba0);
    puVar2 = local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2cb8;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_2cb0.ptr_;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2ca8[0]._0_8_;
    local_2cb8 = (undefined1  [8])0x0;
    sStack_2cb0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2ca8[0]._M_allocated_capacity = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar2);
    }
    if (local_2cb8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2cb8);
    }
  }
  testing::Message::Message((Message *)local_2cb8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2d08,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c2,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
  if (local_2cb8 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2cb8 + 8))();
    }
    local_2cb8 = (undefined1  [8])0x0;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_a10.txid,local_a10.vout);
      local_2d08 = (undefined1  [8])&local_2cf8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d08,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2bb8,(string *)local_2d08);
      local_2bd8._M_dataplus._M_p = (pointer)&local_2bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2bd8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2d28,&local_2bd8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2a58);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8,&local_2bb8,
                 (Privkey *)&local_2d28,&local_2a58,true);
      if (local_2d28._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2d28._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2bd8._M_dataplus._M_p != &local_2bd8.field_2) {
        operator_delete(local_2bd8._M_dataplus._M_p);
      }
      if (local_2bb8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bb8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2d08 != (undefined1  [8])&local_2cf8) {
        operator_delete((void *)local_2d08);
      }
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c7,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_a10.txid,local_a10.vout);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8);
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c8,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2cb8,(ConfidentialTransactionContext *)local_2ba0);
    puVar2 = local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2cb8;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_2cb0.ptr_;
    local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2ca8[0]._0_8_;
    local_2cb8 = (undefined1  [8])0x0;
    sStack_2cb0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2ca8[0]._M_allocated_capacity = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar2);
    }
    if (local_2cb8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2cb8);
    }
  }
  testing::Message::Message((Message *)local_2cb8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2d08,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c9,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
  if (local_2cb8 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2cb8 + 8))();
    }
    local_2cb8 = (undefined1  [8])0x0;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_f00.txid,local_f00.vout);
      local_2d08 = (undefined1  [8])&local_2cf8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d08,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2bb8,(string *)local_2d08);
      local_2bd8._M_dataplus._M_p = (pointer)&local_2bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2bd8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2d28,&local_2bd8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2a64);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8,&local_2bb8,
                 (Privkey *)&local_2d28,&local_2a64,true);
      if (local_2d28._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2d28._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2bd8._M_dataplus._M_p != &local_2bd8.field_2) {
        operator_delete(local_2bd8._M_dataplus._M_p);
      }
      if (local_2bb8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bb8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2d08 != (undefined1  [8])&local_2cf8) {
        operator_delete((void *)local_2d08);
      }
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4ce,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2cb8,&local_f00.txid,local_f00.vout);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2ba0,(OutPoint *)local_2cb8);
      local_2cb8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2cb0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2cb0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4cf,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ByteData *)local_2cb8,(ConfidentialTransactionContext *)local_2ba0);
      puVar2 = local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_2cb8;
      local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_2cb0.ptr_;
      local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_2ca8[0]._0_8_;
      local_2cb8 = (undefined1  [8])0x0;
      sStack_2cb0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2ca8[0]._M_allocated_capacity = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar2);
      }
      if (local_2cb8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2cb8);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d1,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d08,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d08);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  AVar8 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)local_2ba0,(ConfidentialAssetId *)0x0);
  local_2d08 = (undefined1  [8])AVar8.amount_;
  local_2d00.ptr_._0_1_ = AVar8.ignore_check_;
  local_2d28._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2d08);
  local_2bd8._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_2a08);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_2cb8,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2d28,(long *)&local_2bd8);
  if (local_2cb8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d08);
    if (sStack_2cb0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_2cb0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2d28,(Message *)local_2d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2d28);
    if (local_2d08 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2d08 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2d08 + 8))();
      }
      local_2d08 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2cb0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2cb8,&local_2bf8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d08,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000\""
             ,(char *)local_2cb8,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000"
            );
  if (local_2cb8 != (undefined1  [8])local_2ca8) {
    operator_delete((void *)local_2cb8);
  }
  if (local_2d08[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2cb8);
    if ((undefined8 *)CONCAT71(local_2d00.ptr_._1_7_,local_2d00.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_2d00.ptr_._1_7_,local_2d00.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2d28,(Message *)local_2cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2d28);
    if (local_2cb8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2cb8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2cb8 + 8))();
      }
      local_2cb8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2ba0);
  local_2d08._0_4_ = uVar5;
  local_2d28._M_dataplus._M_p._0_4_ = 0x2f9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2cb8,"txc.GetVsize()","761",(uint *)local_2d08,(int *)&local_2d28);
  if (local_2cb8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d08);
    if (sStack_2cb0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_2cb0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2d28,(Message *)local_2d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2d28);
    if (local_2d08 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2d08 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2d08 + 8))();
      }
      local_2d08 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2cb0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2ba0);
  local_2bd8._M_dataplus._M_p._0_4_ = (uVar5 * 0xb) / 100;
  local_2d08._0_4_ = 0x53;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2cb8,"minimum_fee","83",(uint *)&local_2bd8,(int *)local_2d08);
  if (local_2cb8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d08);
    if (sStack_2cb0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_2cb0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2d28,(Message *)local_2d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2d28);
    if (local_2d08 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2d08 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2d08 + 8))();
      }
      local_2d08 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2cb0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2bf8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2bf8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2ba0);
  local_2998.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710
  ;
  if (local_2998.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2998.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2ab8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_2a98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_29c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_29f8);
  local_2a40._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_2a40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a40.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_2710);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_2560);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_28c0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1dd0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2a80);
  if (local_2930.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2930.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2930.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2930.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2930.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2930.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2930.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2930.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_23b0.format_data_);
  cfd::core::Script::~Script(&local_23b0.redeem_script_);
  local_23b0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_23b0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_23b0.script_tree_.super_TapBranch);
  if (local_23b0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23b0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_23b0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23b0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_23b0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23b0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23b0.address_._M_dataplus._M_p != &local_23b0.address_.field_2) {
    operator_delete(local_23b0.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_2238.format_data_);
  cfd::core::Script::~Script(&local_2238.redeem_script_);
  local_2238.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_2238.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_2238.script_tree_.super_TapBranch);
  if (local_2238.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2238.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2238.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2238.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2238.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2238.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2238.address_._M_dataplus._M_p != &local_2238.address_.field_2) {
    operator_delete(local_2238.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_20c0.format_data_);
  cfd::core::Script::~Script(&local_20c0.redeem_script_);
  local_20c0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_20c0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_20c0.script_tree_.super_TapBranch);
  if (local_20c0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20c0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20c0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20c0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20c0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20c0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20c0.address_._M_dataplus._M_p != &local_20c0.address_.field_2) {
    operator_delete(local_20c0.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1f48.format_data_);
  cfd::core::Script::~Script(&local_1f48.redeem_script_);
  local_1f48.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1f48.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1f48.script_tree_.super_TapBranch);
  if (local_1f48.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f48.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f48.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f48.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f48.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f48.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f48.address_._M_dataplus._M_p != &local_1f48.address_.field_2) {
    operator_delete(local_1f48.address_._M_dataplus._M_p);
  }
  cfd::UtxoData::~UtxoData(&local_f00);
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_520);
  local_2ae8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_2ae8.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_AssetLimitAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{2000000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_b;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_b;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  Address address4 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr4 = ElementsConfidentialAddress(
      address4, key.DerivePubkey(94).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount());
  map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), reserve_ct_addr4.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, Amount(int64_t{2100000000000000}), exp_dummy_asset_b);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 761);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 83);
}